

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::anon_unknown_0::ShaderImageLoadStoreBase::BuildShaderProgram
          (ShaderImageLoadStoreBase *this,GLenum type,char *src)

{
  GLuint GVar1;
  GLchar local_428 [8];
  GLchar log [1024];
  GLint status;
  GLuint p;
  char *src_local;
  ShaderImageLoadStoreBase *pSStack_10;
  GLenum type_local;
  ShaderImageLoadStoreBase *this_local;
  
  _status = src;
  src_local._4_4_ = type;
  pSStack_10 = this;
  log._1020_4_ = glu::CallLogWrapper::glCreateShaderProgramv
                           (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,type,1,
                            (GLchar **)&status);
  glu::CallLogWrapper::glGetProgramiv
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,log._1020_4_,0x8b82,
             (GLint *)(log + 0x3f8));
  if (log._1016_4_ == 0) {
    glu::CallLogWrapper::glGetProgramInfoLog
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,log._1020_4_,0x400,
               (GLsizei *)0x0,local_428);
    anon_unknown_0::Output("Program Info Log:\n%s\n%s\n",local_428,_status);
  }
  GVar1._0_1_ = log[0x3fc];
  GVar1._1_1_ = log[0x3fd];
  GVar1._2_1_ = log[0x3fe];
  GVar1._3_1_ = log[0x3ff];
  return GVar1;
}

Assistant:

GLuint BuildShaderProgram(GLenum type, const char* src)
	{
		const GLuint p = glCreateShaderProgramv(type, 1, &src);

		GLint status;
		glGetProgramiv(p, GL_LINK_STATUS, &status);
		if (status == GL_FALSE)
		{
			GLchar log[1024];
			glGetProgramInfoLog(p, sizeof(log), NULL, log);
			Output("Program Info Log:\n%s\n%s\n", log, src);
		}

		return p;
	}